

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O1

bool __thiscall
deqp::ShaderIntegerMixRenderCase::probe_pixel
          (ShaderIntegerMixRenderCase *this,TestLog *log,char *stage,int x,int y,IVec4 *expected)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  bool bVar6;
  IVec4 pixel;
  Vector<int,_4> local_1c8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  local_1c8.m_data[0] = 0;
  local_1c8.m_data[1] = 0;
  local_1c8.m_data[2] = 0;
  local_1c8.m_data[3] = 0;
  glwReadPixels(x,y,1,1,0x8d99,0x1404,&local_1c8);
  bVar6 = true;
  if (expected->m_data[0] == local_1c8.m_data[0]) {
    uVar3 = 0xffffffffffffffff;
    do {
      if (uVar3 == 2) {
        uVar5 = 3;
        break;
      }
      lVar1 = uVar3 + 2;
      uVar5 = uVar3 + 1;
      lVar2 = uVar3 + 2;
      uVar3 = uVar5;
    } while (expected->m_data[lVar1] == local_1c8.m_data[lVar2]);
    bVar6 = uVar5 < 3;
  }
  if (bVar6 != false) {
    local_1b0 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    if (stage == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(stage);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,stage,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," shader failed at pixel (",0x19);
    std::ostream::operator<<((ostringstream *)&local_1a8,x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
    std::ostream::operator<<((ostringstream *)&local_1a8,y);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,").  ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Got ",4);
    tcu::operator<<((ostream *)&local_1a8,&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", expected ",0xb);
    tcu::operator<<((ostream *)&local_1a8,expected);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,").",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return (bool)(bVar6 ^ 1);
}

Assistant:

bool probe_pixel(TestLog& log, const char* stage, int x, int y, const tcu::IVec4& expected)
	{
		tcu::IVec4 pixel;

		glReadPixels(x, y, 1, 1, GL_RGBA_INTEGER, GL_INT, &pixel);

		if (expected != pixel)
		{
			log << TestLog::Message << stage << " shader failed at pixel (" << x << ", " << y << ").  "
				<< "Got " << pixel << ", expected " << expected << ")." << TestLog::EndMessage;
			return false;
		}

		return true;
	}